

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_bc6e::read_modern_inc(char *file_name)

{
  system_error *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  error_code __ec;
  file file;
  file_descriptor_handle local_60;
  uint local_58 [2];
  error_category *local_50;
  char *local_48;
  path local_40;
  
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_40,&local_48,auto_format);
  local_58[0] = 0;
  local_50 = (error_category *)std::_V2::system_category();
  local_60.fd_ = -1;
  local_60.delete_ = false;
  local_60._5_3_ = 0;
  io::posix::file::open((file *)&local_60,(char *)&local_40,0,0x180,local_58);
  if (local_58[0] == 0) {
    std::filesystem::__cxx11::path::~path(&local_40);
    (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40._M_pathname._M_string_length =
         (long)(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_40._M_pathname.field_2._M_allocated_capacity = 0x7fffffffffffffff;
    io::
    read_all<io::posix::file,io::net::dynamic_vector_buffer<unsigned_char,std::allocator<unsigned_char>>,void>
              ((file *)&local_60,
               (dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
    io::posix::file_descriptor_handle::~file_descriptor_handle(&local_60);
    return in_RDI;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = local_58[0];
  __ec._M_cat = local_50;
  std::system_error::system_error(this,__ec);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::vector<std::uint8_t> read_modern_inc(const char* file_name)
{
    auto file = io::open_file(file_name, io::open_mode::read_only);
    std::vector<uint8_t> output;
    io::read_all(file, io::dynamic_buffer(output));
    return output;
}